

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::DisplayFinalEntries(cmComputeLinkDepends *this)

{
  FILE *pFVar1;
  bool bVar2;
  undefined8 uVar3;
  reference pLVar4;
  LinkEntry *lei;
  iterator __end1;
  iterator __begin1;
  EntryVector *__range1;
  cmComputeLinkDepends *this_local;
  
  pFVar1 = _stderr;
  cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"target [%s] links to:\n",uVar3);
  __end1 = std::
           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ::begin(&this->FinalLinkEntries);
  lei = (LinkEntry *)
        std::
        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
        end(&this->FinalLinkEntries);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                                *)&lei);
    if (!bVar2) break;
    pLVar4 = __gnu_cxx::
             __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
             ::operator*(&__end1);
    pFVar1 = _stderr;
    if (pLVar4->Target == (cmGeneratorTarget *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"  item [%s]\n",uVar3);
    }
    else {
      cmGeneratorTarget::GetName_abi_cxx11_(pLVar4->Target);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"  target [%s]\n",uVar3);
    }
    __gnu_cxx::
    __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
    ::operator++(&__end1);
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayFinalEntries()
{
  fprintf(stderr, "target [%s] links to:\n", this->Target->GetName().c_str());
  for (LinkEntry const& lei : this->FinalLinkEntries) {
    if (lei.Target) {
      fprintf(stderr, "  target [%s]\n", lei.Target->GetName().c_str());
    } else {
      fprintf(stderr, "  item [%s]\n", lei.Item.c_str());
    }
  }
  fprintf(stderr, "\n");
}